

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3e00dc::AVxEncoderThreadTest::~AVxEncoderThreadTest(AVxEncoderThreadTest *this)

{
  undefined8 *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *unaff_retaddr;
  
  *in_RDI = &PTR__AVxEncoderThreadTest_01f4dda8;
  in_RDI[2] = &PTR__AVxEncoderThreadTest_01f4de10;
  in_RDI[3] = &PTR__AVxEncoderThreadTest_01f4de30;
  if ((long *)in_RDI[0x82] != (long *)0x0) {
    (**(code **)(*(long *)in_RDI[0x82] + 8))();
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(unaff_retaddr);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(unaff_retaddr);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)unaff_retaddr);
  libaom_test::EncoderTest::~EncoderTest((EncoderTest *)0x53260b);
  libaom_test::CodecTestWith5Params<libaom_test::TestMode,_int,_int,_int,_int>::
  ~CodecTestWith5Params((CodecTestWith5Params<libaom_test::TestMode,_int,_int,_int,_int> *)0x532614)
  ;
  return;
}

Assistant:

~AVxEncoderThreadTest() override { delete decoder_; }